

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeBlocks.cpp
# Opt level: O2

Pass * wasm::createMergeBlocksPass(void)

{
  MergeBlocks *this;
  
  this = (MergeBlocks *)operator_new(0x140);
  memset(this,0,0x140);
  MergeBlocks::MergeBlocks(this);
  return (Pass *)this;
}

Assistant:

Pass* createMergeBlocksPass() { return new MergeBlocks(); }